

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O1

ssize_t program_filter_read(archive_read_filter *self,void **buff)

{
  void *pvVar1;
  program_filter *state;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  void *__buf;
  ssize_t request;
  ulong uVar5;
  size_t __nbytes;
  void *__buf_00;
  ssize_t avail;
  size_t local_40;
  void **local_38;
  
  pvVar1 = self->data;
  local_38 = buff;
  if (*(int *)((long)pvVar1 + 0x28) == -1) {
    uVar5 = 0;
  }
  else {
    __buf_00 = *(void **)((long)pvVar1 + 0x30);
    uVar5 = 0;
    do {
      __nbytes = *(ulong *)((long)pvVar1 + 0x38) - uVar5;
      if (*(ulong *)((long)pvVar1 + 0x38) < uVar5 || __nbytes == 0) break;
      state = (program_filter *)self->data;
      if (0x7ffffffffffffffe < __nbytes) {
        __nbytes = 0x7fffffffffffffff;
      }
LAB_0011af19:
      sVar3 = read(state->child_stdout,__buf_00,__nbytes);
      if (sVar3 == 0xffffffffffffffff) {
        piVar4 = __errno_location();
        if (*piVar4 == 4) goto LAB_0011af19;
      }
      if (0 < (long)sVar3) goto LAB_0011b090;
      if (sVar3 == 0) {
LAB_0011b082:
        iVar2 = child_stop(self,state);
        sVar3 = (long)iVar2;
        goto LAB_0011b090;
      }
      if (sVar3 == 0xffffffffffffffff) {
        piVar4 = __errno_location();
        if (*piVar4 != 0xb) {
          sVar3 = 0xffffffffffffffff;
          if (*piVar4 == 0x20) goto LAB_0011b082;
          goto LAB_0011b090;
        }
      }
      if (state->child_stdin == -1) {
        __archive_check_child(-1,state->child_stdout);
        goto LAB_0011af19;
      }
      __buf = __archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_40);
      if (__buf != (void *)0x0) {
        do {
          request = write(state->child_stdin,__buf,local_40);
          if (request != -1) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        if (request < 1) {
          if (request == -1) {
            piVar4 = __errno_location();
            if (*piVar4 == 0xb) {
              __archive_check_child(state->child_stdin,state->child_stdout);
            }
            else {
              close(state->child_stdin);
              state->child_stdin = -1;
              fcntl(state->child_stdout,4,0);
              if (*piVar4 != 0x20) {
                sVar3 = 0xffffffffffffffff;
                goto LAB_0011b090;
              }
            }
          }
          else {
            close(state->child_stdin);
            state->child_stdin = -1;
            fcntl(state->child_stdout,4,0);
          }
        }
        else {
          __archive_read_filter_consume(self->upstream,request);
        }
        goto LAB_0011af19;
      }
      close(state->child_stdin);
      state->child_stdin = -1;
      fcntl(state->child_stdout,4,0);
      sVar3 = local_40;
      if (-1 < (long)local_40) goto LAB_0011af19;
LAB_0011b090:
      if ((long)sVar3 < 0) {
        return -0x1e;
      }
      if (sVar3 == 0) break;
      uVar5 = uVar5 + sVar3;
      __buf_00 = (void *)((long)__buf_00 + sVar3);
    } while (*(int *)((long)pvVar1 + 0x28) != -1);
  }
  *local_38 = *(void **)((long)pvVar1 + 0x30);
  return uVar5;
}

Assistant:

static ssize_t
program_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct program_filter *state;
	ssize_t bytes;
	size_t total;
	char *p;

	state = (struct program_filter *)self->data;

	total = 0;
	p = state->out_buf;
	while (state->child_stdout != -1 && total < state->out_buf_len) {
		bytes = child_read(self, p, state->out_buf_len - total);
		if (bytes < 0)
			/* No recovery is possible if we can no longer
			 * read from the child. */
			return (ARCHIVE_FATAL);
		if (bytes == 0)
			/* We got EOF from the child. */
			break;
		total += bytes;
		p += bytes;
	}

	*buff = state->out_buf;
	return (total);
}